

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O0

int ComputeQCostBits(Cube *p)

{
  varvalue vVar1;
  int iVar2;
  undefined4 local_1c;
  int Value;
  int nLitsN;
  int nLits;
  int v;
  Cube *p_local;
  
  Value = 0;
  local_1c = 0;
  for (nLitsN = 0; nLitsN < g_CoverInfo.nVarsIn; nLitsN = nLitsN + 1) {
    vVar1 = GetVar(p,nLitsN);
    if (vVar1 == VAR_NEG) {
      local_1c = local_1c + 1;
    }
    else if (vVar1 == VAR_POS) {
      Value = Value + 1;
    }
  }
  iVar2 = GetQCost(local_1c + Value,local_1c);
  return iVar2;
}

Assistant:

int ComputeQCostBits( Cube * p )
{
    extern varvalue GetVar( Cube* pC, int Var );
    int v, nLits = 0, nLitsN = 0;
    for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
    {
        int Value = GetVar( p, v );
        if ( Value == VAR_NEG )
            nLitsN++;
        else if ( Value == VAR_POS )
            nLits++;
    }
    nLits += nLitsN;
    return GetQCost( nLits, nLitsN );
}